

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  string *psVar1;
  
  psVar1 = *(string **)(*(long *)(*(FileDescriptor **)(desc + 0x10) + 0x88) + 0x78);
  if (*(long *)(psVar1 + 8) == 0) {
    ReservedNamePrefix(__return_storage_ptr__,classname,*(FileDescriptor **)(desc + 0x10));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}